

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_DamageMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int amount;
  int selector;
  bool bVar1;
  AActor *source;
  AActor *inflictor;
  AActor *pAVar2;
  AActor *pAVar3;
  int iVar4;
  int selector_00;
  char *pcVar5;
  int iVar6;
  int local_44;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003ed502;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ed4d3:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ed502:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x170d,
                  "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003ed2f2;
    bVar1 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ed502;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003ed4d3;
LAB_003ed2f2:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_003ed52a:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x170e,
                  "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ed52a;
  }
  amount = param[1].field_0.i;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003ed5b8;
    }
    iVar6 = param[2].field_0.i;
LAB_003ed345:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed5d7:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1710,
                    "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_44 = param[3].field_0.i;
LAB_003ed354:
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003ed4dc:
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ed4e3:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1711,
                    "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (local_40 != (PClassActor *)0x0) goto LAB_003ed4dc;
      local_40 = (PClassActor *)0x0;
    }
LAB_003ed376:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed587:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1712,
                    "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[5].field_0.i;
LAB_003ed385:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed568:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1713,
                    "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003ed5b8:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x170f,
                    "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ed345;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ed5d7;
    }
    local_44 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003ed354;
    }
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (local_40 = (PClassActor *)param[4].field_0.field_1.a,
       local_40 != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar5 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ed4e3;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ed376;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ed587;
    }
    iVar4 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003ed385;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ed568;
    }
    selector_00 = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003ed549;
      }
      goto LAB_003ed3ac;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed549:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1714,
                  "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003ed3ac:
  selector = param[7].field_0.i;
  source = COPY_AAPTR(pAVar3,selector_00);
  inflictor = COPY_AAPTR(pAVar3,selector);
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->master);
  if (pAVar2 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->master);
    local_38.Index = iVar4;
    local_34.Index = iVar6;
    DoDamage(pAVar3,inflictor,source,amount,&local_34,local_44,local_40,&local_38);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->master != NULL)
		DoDamage(self->master, inflictor, source, amount, damagetype, flags, filter, species);
	return 0;
}